

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_readdir_ex
              (LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t buffer_maxlen,char *longentry,
              size_t longentry_maxlen,LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  LIBSSH2_SESSION *session;
  uint uVar1;
  time_t start_time;
  ulong uVar2;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    uVar2 = 0xffffffd9;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      uVar2 = sftp_readdir(hnd,buffer,buffer_maxlen,longentry,longentry_maxlen,attrs);
      if (((uVar2 != 0xffffffffffffffdb) ||
          (session = hnd->sftp->channel->session, session == (LIBSSH2_SESSION *)0x0)) ||
         (session->api_block_mode == 0)) break;
      uVar1 = _libssh2_wait_socket(session,start_time);
      uVar2 = (ulong)uVar1;
    } while (uVar1 == 0);
  }
  return (int)uVar2;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_readdir_ex(LIBSSH2_SFTP_HANDLE *hnd, char *buffer,
                        size_t buffer_maxlen, char *longentry,
                        size_t longentry_maxlen,
                        LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    ssize_t rc;
    if(!hnd)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_readdir(hnd, buffer, buffer_maxlen, longentry,
                              longentry_maxlen, attrs));
    return (int)rc;  /* FIXME: -> ssize_t */
}